

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_record.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  char *format;
  int iVar14;
  ulong uVar15;
  float fVar16;
  undefined4 uVar17;
  float in_XMM1_Da;
  undefined4 uVar18;
  float fVar19;
  ALLEGRO_PATH *tmp_path;
  ALLEGRO_EVENT e;
  long local_e0;
  long local_c8;
  ulong local_c0;
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  int local_78 [9];
  int local_54;
  
  local_c8 = 0;
  cVar3 = al_install_system(0x85020700,atexit);
  if (cVar3 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    cVar3 = al_init_primitives_addon();
    if (cVar3 == '\0') {
      format = "Unable to initialize primitives addon";
    }
    else {
      cVar3 = al_install_keyboard();
      if (cVar3 == '\0') {
        format = "Unable to install keyboard";
      }
      else {
        cVar3 = al_install_audio();
        if (cVar3 == '\0') {
          format = "Unable to initialize audio addon";
        }
        else {
          cVar3 = al_init_acodec_addon();
          if (cVar3 == '\0') {
            format = "Unable to initialize acodec addon";
          }
          else {
            lVar6 = al_create_audio_recorder(1000,0x500,0x5622,8,0x10);
            if (lVar6 == 0) {
              format = "Unable to create audio recorder";
            }
            else {
              lVar7 = al_create_audio_stream(4,0x1000,0x5622,8,0x10);
              if (lVar7 == 0) {
                format = "Unable to create audio stream";
              }
              else {
                local_c0 = 0;
                al_reserve_samples(0);
                al_set_audio_stream_playing(lVar7,0);
                uVar8 = al_get_default_mixer();
                al_attach_audio_stream_to_mixer(lVar7,uVar8);
                uVar8 = al_create_event_queue();
                al_set_new_display_option(0x11,1,2);
                al_set_new_display_option(0x12,8,2);
                lVar9 = al_create_display(0x140,0x100);
                if (lVar9 != 0) {
                  al_set_window_title(lVar9,"SPACE to record. P to playback.");
                  uVar10 = al_get_audio_recorder_event_source(lVar6);
                  al_register_event_source(uVar8,uVar10);
                  uVar10 = al_get_audio_stream_event_source(lVar7);
                  al_register_event_source(uVar8,uVar10);
                  uVar10 = al_get_display_event_source(lVar9);
                  al_register_event_source(uVar8,uVar10);
                  uVar10 = al_get_keyboard_event_source();
                  al_register_event_source(uVar8,uVar10);
                  local_a0 = lVar6;
                  al_start_audio_recorder(lVar6);
                  bVar2 = false;
                  iVar5 = 0;
                  local_e0 = 0;
                  local_b8 = uVar8;
                  local_98 = lVar7;
LAB_00102730:
                  al_wait_for_event(uVar8,local_78);
                  if (local_78[0] < 0x201) {
                    if (local_78[0] != 0xb) {
                      if (local_78[0] == 0x2a) {
LAB_00102ba2:
                        al_destroy_audio_recorder(local_a0);
                        al_destroy_audio_stream(lVar7);
                        if (local_e0 != 0) {
                          al_fclose(local_e0);
                        }
                        if (local_c8 != 0) {
                          uVar8 = al_path_cstr(local_c8,0x2f);
                          al_remove_filename(uVar8);
                          al_destroy_path(local_c8);
                        }
                        return 0;
                      }
                      goto LAB_00102730;
                    }
                    if (local_54 == 0x20) {
                      if (bVar2) {
                        if (local_e0 != 0) {
                          al_fclose(local_e0);
                        }
                        bVar2 = false;
                        goto LAB_00102b1e;
                      }
                      cVar3 = al_get_audio_stream_playing(lVar7);
                      if (cVar3 != '\0') {
                        al_drain_audio_stream(lVar7);
                      }
                      if (local_c8 == 0) {
                        local_e0 = al_make_temp_file("alrecXXX.raw",&local_c8);
                      }
                      else {
                        if (local_e0 != 0) {
                          al_fclose(local_e0);
                        }
                        uVar10 = al_path_cstr(local_c8,0x2f);
                        local_e0 = al_fopen(uVar10,"w");
                      }
                      bVar2 = true;
                      local_c0 = 0;
                      goto LAB_00102730;
                    }
                    if (local_54 != 0x70) {
                      if (local_54 == 0x1b) goto LAB_00102ba2;
                      goto LAB_00102730;
                    }
                    if (local_c8 == 0 || bVar2) goto LAB_00102730;
                    uVar10 = al_path_cstr(local_c8,0x2f);
                    local_e0 = al_fopen(uVar10,"r");
                    if (local_e0 != 0) {
                      al_set_audio_stream_playing(lVar7,1);
                      goto LAB_00102730;
                    }
                  }
                  else {
                    if (local_78[0] != 0x201) {
                      if (local_78[0] == 0x203) {
                        lVar9 = al_get_audio_recorder_event(local_78);
                        lVar6 = *(long *)(lVar9 + 0x20);
                        iVar4 = *(int *)(lVar9 + 0x28);
                        lVar9 = (long)iVar4;
                        if (lVar9 < 1) {
                          fVar16 = 0.0;
                        }
                        else {
                          lVar11 = 0;
                          iVar14 = 0;
                          do {
                            iVar13 = *(byte *)(lVar6 + lVar11) - 0x80;
                            iVar12 = -iVar13;
                            if (0 < iVar13) {
                              iVar12 = iVar13;
                            }
                            if (iVar12 < iVar14) {
                              iVar12 = iVar14;
                            }
                            iVar14 = iVar12;
                            lVar11 = lVar11 + 1;
                          } while (lVar9 != lVar11);
                          fVar16 = (float)iVar14;
                        }
                        al_map_rgb(0,0,0);
                        al_clear_to_color();
                        if (bVar2) {
                          if ((local_e0 != 0) && (iVar14 = (int)local_c0, iVar14 < 0x1430)) {
                            al_fwrite(local_e0,lVar6,lVar9);
                            local_c0 = (ulong)(iVar14 + 1);
                          }
                          uVar1 = iVar4 / 0x140;
                          local_80 = (ulong)uVar1;
                          local_88 = (long)(int)uVar1;
                          lVar11 = 0;
                          iVar14 = 0;
                          iVar4 = iVar5;
                          local_90 = lVar9;
                          do {
                            lVar7 = local_88;
                            iVar13 = iVar14 * (int)local_80;
                            iVar12 = iVar13 + (int)local_80;
                            if ((int)local_90 <= iVar12) {
                              iVar12 = (int)local_90;
                            }
                            iVar5 = 0;
                            if (iVar13 < iVar12) {
                              iVar5 = 0;
                              lVar9 = lVar11;
                              do {
                                iVar5 = iVar5 + (uint)*(byte *)(lVar6 + lVar9) + -0x80;
                                lVar9 = lVar9 + 1;
                              } while (lVar9 < iVar12);
                            }
                            iVar5 = iVar5 / (int)local_88;
                            local_a4 = (float)(iVar14 + -1);
                            uVar18 = 0x43800000;
                            local_a8 = (float)iVar14;
                            local_ac = ((float)(iVar4 + 0x80) / 255.0) * 256.0 + 128.0 + -128.0;
                            local_b0 = ((float)(iVar5 + 0x80) / 255.0) * 256.0 + 128.0 + -128.0;
                            uVar17 = al_map_rgb(0xff,0xff,0xff);
                            in_XMM1_Da = local_ac;
                            al_draw_line(local_a4,local_ac,local_a8,local_b0,uVar17,uVar18,
                                         0x3f99999a);
                            iVar14 = iVar14 + 1;
                            lVar11 = lVar11 + lVar7;
                            lVar7 = local_98;
                            uVar8 = local_b8;
                            iVar4 = iVar5;
                          } while (iVar14 != 0x140);
                        }
                        uVar17 = al_map_rgba(0,0xff,0);
                        fVar19 = 251.0;
                        al_draw_filled_rectangle
                                  ((fVar16 / 127.0) * 320.0,0x437b0000,0,0x43800000,uVar17,
                                   in_XMM1_Da);
                        al_flip_display();
                        in_XMM1_Da = fVar19;
                      }
                      goto LAB_00102730;
                    }
                    if (local_e0 != 0) {
                      lVar6 = al_get_audio_stream_fragment(lVar7);
                      if (lVar6 != 0) {
                        uVar15 = 0;
                        do {
                          lVar9 = al_fread(local_e0,lVar6 + uVar15,0x1000 - uVar15);
                          uVar15 = lVar9 + uVar15;
                          if (0xfff < uVar15) goto LAB_00102856;
                          cVar3 = al_feof(local_e0);
                        } while ((cVar3 == '\0') && (iVar4 = al_ferror(local_e0), iVar4 == 0));
                        memset((void *)(lVar6 + uVar15),0x80,0x1000 - uVar15);
LAB_00102856:
                        al_set_audio_stream_fragment(lVar7,lVar6);
                        iVar4 = al_ferror(local_e0);
                        if ((iVar4 != 0) ||
                           (cVar3 = al_feof(local_e0), uVar8 = local_b8, cVar3 != '\0')) {
                          al_drain_audio_stream(lVar7);
                          al_fclose(local_e0);
                          local_e0 = 0;
                          uVar8 = local_b8;
                        }
                      }
                      goto LAB_00102730;
                    }
                  }
LAB_00102b1e:
                  local_e0 = 0;
                  goto LAB_00102730;
                }
                format = "Error creating display\n";
              }
            }
          }
        }
      }
    }
  }
  abort_example(format);
  iVar5 = __cxa_atexit();
  return iVar5;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_AUDIO_RECORDER *r;
   ALLEGRO_AUDIO_STREAM *s;
   
   ALLEGRO_EVENT_QUEUE *q;
   ALLEGRO_DISPLAY *d;
   ALLEGRO_FILE *fp = NULL;
   ALLEGRO_PATH *tmp_path = NULL;
      
   int prev = 0;
   bool is_recording = false;
   
   int n = 0; /* number of samples written to disk */
   
   (void) argc;
   (void) argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   if (!al_init_primitives_addon()) {
      abort_example("Unable to initialize primitives addon");
   }
      
   if (!al_install_keyboard()) {
      abort_example("Unable to install keyboard");
   }
      
   if (!al_install_audio()) {
      abort_example("Unable to initialize audio addon");
   }
   
   if (!al_init_acodec_addon()) {
      abort_example("Unable to initialize acodec addon");
   }
   
   /* Note: increasing the number of channels will break this demo. Other
    * settings can be changed by modifying the constants at the top of the
    * file.
    */
   r = al_create_audio_recorder(1000, samples_per_fragment, frequency,
      audio_depth, ALLEGRO_CHANNEL_CONF_1);
   if (!r) {
      abort_example("Unable to create audio recorder");
   }
   
   s = al_create_audio_stream(playback_fragment_count,
      playback_samples_per_fragment, frequency, audio_depth,
      ALLEGRO_CHANNEL_CONF_1);      
   if (!s) {
      abort_example("Unable to create audio stream");
   }
      
   al_reserve_samples(0);
   al_set_audio_stream_playing(s, false);
   al_attach_audio_stream_to_mixer(s, al_get_default_mixer());
      
   q = al_create_event_queue();
   
   /* Note: the following two options are referring to pixel samples, and have
    * nothing to do with audio samples. */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   
   d = al_create_display(320, 256);
   if (!d) {
      abort_example("Error creating display\n");
   }
      
   al_set_window_title(d, "SPACE to record. P to playback.");
   
   al_register_event_source(q, al_get_audio_recorder_event_source(r));
   al_register_event_source(q, al_get_audio_stream_event_source(s));
   al_register_event_source(q, al_get_display_event_source(d));
   al_register_event_source(q, al_get_keyboard_event_source());
   
   al_start_audio_recorder(r);
   
   while (true) {
      ALLEGRO_EVENT e;

      al_wait_for_event(q, &e);
       
      if (e.type == ALLEGRO_EVENT_AUDIO_RECORDER_FRAGMENT) {
         /* We received an incoming fragment from the microphone. In this
          * example, the recorder is constantly recording even when we aren't
          * saving to disk. The display is updated every time a new fragment
          * comes in, because it makes things more simple. If the fragments
          * are coming in faster than we can update the screen, then it will be
          * a problem.
          */          
         ALLEGRO_AUDIO_RECORDER_EVENT *re = al_get_audio_recorder_event(&e);
         audio_buffer_t input = (audio_buffer_t) re->buffer;
         int sample_count = re->samples; 
         const int R = sample_count / 320;
         int i, gain = 0;
         
         /* Calculate the volume, and display it regardless if we are actively
          * recording to disk. */
         for (i = 0; i < sample_count; ++i) {
            if (gain < abs(input[i] - sample_center))
               gain = abs(input[i] - sample_center);
         }
        
         al_clear_to_color(al_map_rgb(0,0,0));
        
         if (is_recording) {
            /* Save raw bytes to disk. Assumes everything is written
             * succesfully. */
            if (fp && n < frequency / (float) samples_per_fragment * 
               max_seconds_to_record) {
               al_fwrite(fp, input, sample_count * sample_size);
               ++n;
            }

            /* Draw a pathetic visualization. It draws exactly one fragment
             * per frame. This means the visualization is dependent on the 
             * various parameters. A more thorough implementation would use this
             * event to copy the new data into a circular buffer that holds a
             * few seconds of audio. The graphics routine could then always
             * draw that last second of audio, which would cause the
             * visualization to appear constant across all different settings.
             */
            for (i = 0; i < 320; ++i) {
               int j, c = 0;
               
               /* Take the average of R samples so it fits on the screen */
               for (j = i * R; j < i * R + R && j < sample_count; ++j) {
                  c += input[j] - sample_center;
               }
               c /= R;
               
               /* Draws a line from the previous sample point to the next */
               al_draw_line(i - 1, 128 + ((prev - min_sample_val) /
                  (float) sample_range) * 256 - 128, i, 128 +
                  ((c - min_sample_val) / (float) sample_range) * 256 - 128,
                  al_map_rgb(255,255,255), 1.2);
               
               prev = c;
            }
         }
         
         /* draw volume bar */
         al_draw_filled_rectangle((gain / (float) max_sample_val) * 320, 251,
            0, 256, al_map_rgba(0, 255, 0, 128));
            
         al_flip_display();
      }
      else if (e.type == ALLEGRO_EVENT_AUDIO_STREAM_FRAGMENT) {
         /* This event is received when we are playing back the audio clip.
          * See ex_saw.c for an example dedicated to playing streams.
          */
         if (fp) {
            audio_buffer_t output = al_get_audio_stream_fragment(s);
            if (output) {
               /* Fill the buffer from the data we have recorded into the file.
                * If an error occurs (or end of file) then silence out the
                * remainder of the buffer and stop the playback.
                */
               const size_t bytes_to_read =
                  playback_samples_per_fragment * sample_size;
               size_t bytes_read = 0, i;
               
               do {
                  bytes_read += al_fread(fp, (uint8_t *)output + bytes_read,
                     bytes_to_read - bytes_read);                  
               } while (bytes_read < bytes_to_read && !al_feof(fp) &&
                  !al_ferror(fp));
               
               /* silence out unused part of buffer (end of file) */
               for (i = bytes_read / sample_size;
                  i < bytes_to_read / sample_size; ++i) {
                     output[i] = sample_center;
               }
               
               al_set_audio_stream_fragment(s, output);
               
               if (al_ferror(fp) || al_feof(fp)) {
                  al_drain_audio_stream(s);
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
      }      
      else if (e.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (e.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (e.keyboard.unichar == 27) {
            /* pressed ESC */
            break;
         }
         else if (e.keyboard.unichar == ' ') {
            if (!is_recording) {
               /* Start the recording */
               is_recording = true;
               
               if (al_get_audio_stream_playing(s)) {
                  al_drain_audio_stream(s);
               }
               
               /* Reuse the same temp file for all recordings */
               if (!tmp_path) {
                  fp = al_make_temp_file("alrecXXX.raw", &tmp_path);
               }
               else {
                  if (fp) al_fclose(fp);
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "w");
               }
               
               n = 0;
            }
            else {
               is_recording = false;
               if (fp) {
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
         else if (e.keyboard.unichar == 'p') {
            /* Play the previously recorded wav file */
            if (!is_recording) {
               if (tmp_path) {
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "r");
                  if (fp) {
                     al_set_audio_stream_playing(s, true);
                  }
               }
            }
         }
      }
   }
   
   /* clean up */
   al_destroy_audio_recorder(r);
   al_destroy_audio_stream(s);
      
   if (fp)
      al_fclose(fp);
      
   if (tmp_path) {
      al_remove_filename(al_path_cstr(tmp_path, '/'));
      al_destroy_path(tmp_path);
   }
   
   return 0;
}